

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLFileData.h
# Opt level: O3

void __thiscall Assimp::MDL::IntBone_MDL7::IntBone_MDL7(IntBone_MDL7 *this)

{
  (this->super_aiBone).mName.length = 0;
  (this->super_aiBone).mName.data[0] = '\0';
  memset((this->super_aiBone).mName.data + 1,0x1b,0x3ff);
  (this->super_aiBone).mNumWeights = 0;
  (this->super_aiBone).mWeights = (aiVertexWeight *)0x0;
  (this->super_aiBone).mOffsetMatrix.a1 = 1.0;
  (this->super_aiBone).mOffsetMatrix.a2 = 0.0;
  (this->super_aiBone).mOffsetMatrix.a3 = 0.0;
  (this->super_aiBone).mOffsetMatrix.a4 = 0.0;
  (this->super_aiBone).mOffsetMatrix.b1 = 0.0;
  (this->super_aiBone).mOffsetMatrix.b2 = 1.0;
  (this->super_aiBone).mOffsetMatrix.b3 = 0.0;
  (this->super_aiBone).mOffsetMatrix.b4 = 0.0;
  (this->super_aiBone).mOffsetMatrix.c1 = 0.0;
  (this->super_aiBone).mOffsetMatrix.c2 = 0.0;
  (this->super_aiBone).mOffsetMatrix.c3 = 1.0;
  (this->super_aiBone).mOffsetMatrix.c4 = 0.0;
  (this->super_aiBone).mOffsetMatrix.d1 = 0.0;
  (this->super_aiBone).mOffsetMatrix.d2 = 0.0;
  (this->super_aiBone).mOffsetMatrix.d3 = 0.0;
  (this->super_aiBone).mOffsetMatrix.d4 = 1.0;
  this->iParent = 0xffff;
  (this->vPosition).x = 0.0;
  (this->vPosition).y = 0.0;
  (this->vPosition).z = 0.0;
  (this->pkeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pkeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pkeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pkeyScalings).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pkeyScalings).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pkeyScalings).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pkeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pkeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pkeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve(&this->pkeyPositions,0x1e);
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve(&this->pkeyScalings,0x1e);
  std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::reserve(&this->pkeyRotations,0x1e);
  return;
}

Assistant:

IntBone_MDL7() AI_NO_EXCEPT : iParent (0xffff)
    {
        pkeyPositions.reserve(30);
        pkeyScalings.reserve(30);
        pkeyRotations.reserve(30);
    }